

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcReinforcingElement::~IfcReinforcingElement(IfcReinforcingElement *this)

{
  undefined1 *this_00;
  undefined1 *puVar1;
  undefined1 *puVar2;
  
  this_00 = &this[-1].super_IfcBuildingElementComponent.super_IfcBuildingElement.super_IfcElement.
             super_IfcProduct.super_IfcObject.field_0x50;
  *(undefined8 *)
   &this[-1].super_IfcBuildingElementComponent.super_IfcBuildingElement.super_IfcElement.
    super_IfcProduct.super_IfcObject.field_0x50 = 0x81d750;
  *(undefined8 *)
   &(this->super_IfcBuildingElementComponent).super_IfcBuildingElement.super_IfcElement.
    super_IfcProduct.super_IfcObject.field_0x38 = 0x81d890;
  *(undefined8 *)
   &this[-1].super_IfcBuildingElementComponent.super_IfcBuildingElement.super_IfcElement.
    super_IfcProduct.super_IfcObject.field_0xd8 = 0x81d778;
  *(undefined8 *)
   &this[-1].super_IfcBuildingElementComponent.super_IfcBuildingElement.super_IfcElement.
    super_IfcProduct.field_0xe8 = 0x81d7a0;
  *(undefined8 *)
   &this[-1].super_IfcBuildingElementComponent.super_IfcBuildingElement.super_IfcElement.field_0x120
       = 0x81d7c8;
  *(undefined8 *)&this[-1].super_IfcBuildingElementComponent.super_IfcBuildingElement.field_0x150 =
       0x81d7f0;
  *(undefined8 *)&this[-1].field_0x188 = 0x81d818;
  *(undefined8 *)&this[-1].field_0x198 = 0x81d840;
  *(undefined8 *)
   &(this->super_IfcBuildingElementComponent).super_IfcBuildingElement.super_IfcElement.
    super_IfcProduct.super_IfcObject = 0x81d868;
  puVar1 = *(undefined1 **)
            &(this->super_IfcBuildingElementComponent).super_IfcBuildingElement.super_IfcElement.
             super_IfcProduct.super_IfcObject.field_0x10;
  puVar2 = &(this->super_IfcBuildingElementComponent).super_IfcBuildingElement.super_IfcElement.
            super_IfcProduct.super_IfcObject.field_0x20;
  if (puVar1 != puVar2) {
    operator_delete(puVar1,*(long *)puVar2 + 1);
  }
  IfcElement::~IfcElement((IfcElement *)this_00,&PTR_construction_vtable_24__0081d8b8);
  operator_delete(this_00,0x1a8);
  return;
}

Assistant:

IfcReinforcingElement() : Object("IfcReinforcingElement") {}